

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O2

QRect QHighDpi::toNativePixels<QRect,QScreen>(QRect *value,QScreen *context)

{
  QRect QVar1;
  ScaleAndOrigin SVar2;
  
  SVar2 = QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
  QVar1 = scale(value,SVar2.factor,SVar2.origin);
  return QVar1;
}

Assistant:

T toNativePixels(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    return scale(value, so.factor, so.origin);
}